

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float128_lt_quiet_mips64el(float128 a,float128 b,float_status *status)

{
  flag fVar1;
  flag fVar2;
  byte bVar3;
  int32_t iVar4;
  int iVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t b0;
  uint64_t b1;
  ulong a0;
  uint64_t a1;
  uint local_58;
  bool local_51;
  flag bSign;
  flag aSign;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  b0 = b.high;
  b1 = b.low;
  a0 = a.high;
  a1 = a.low;
  iVar4 = extractFloat128Exp(a);
  if (iVar4 == 0x7fff) {
    uVar6 = extractFloat128Frac0(a);
    uVar7 = extractFloat128Frac1(a);
    if (uVar6 != 0 || uVar7 != 0) goto LAB_00c6eb90;
  }
  iVar4 = extractFloat128Exp(b);
  if (iVar4 == 0x7fff) {
    uVar6 = extractFloat128Frac0(b);
    uVar7 = extractFloat128Frac1(b);
    if (uVar6 != 0 || uVar7 != 0) {
LAB_00c6eb90:
      iVar5 = float128_is_signaling_nan_mips64el(a,status);
      if ((iVar5 != 0) || (iVar5 = float128_is_signaling_nan_mips64el(b,status), iVar5 != 0)) {
        float_raise_mips64el('\x01',status);
      }
      return 0;
    }
  }
  fVar1 = extractFloat128Sign(a);
  fVar2 = extractFloat128Sign(b);
  if (fVar1 != fVar2) {
    local_51 = false;
    if (fVar1 != '\0') {
      local_51 = (((a0 | b0) & 0x7fffffffffffffff) != 0 || a1 != 0) || b1 != 0;
    }
    return (uint)local_51;
  }
  if (fVar1 == '\0') {
    bVar3 = lt128(a0,a1,b0,b1);
  }
  else {
    bVar3 = lt128(b0,b1,a0,a1);
  }
  local_58 = (uint)bVar3;
  return local_58;
}

Assistant:

int float128_lt_quiet(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign;

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign != bSign ) {
        return
               aSign
            && (    ( ( (uint64_t) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
                 != 0 );
    }
    return
          aSign ? lt128( b.high, b.low, a.high, a.low )
        : lt128( a.high, a.low, b.high, b.low );

}